

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O2

int Fxu_SingleCountCoincidence(Fxu_Matrix *p,Fxu_Var *pVar1,Fxu_Var *pVar2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fxu_ListLit *pFVar5;
  Fxu_Lit *pFVar6;
  Fxu_ListLit *pFVar7;
  Fxu_Lit *pFVar8;
  bool bVar9;
  
  pFVar7 = &pVar1->lLits;
  pFVar5 = &pVar2->lLits;
  iVar4 = 0;
LAB_003f5214:
  pFVar6 = pFVar5->pHead;
  pFVar8 = pFVar7->pHead;
LAB_003f521a:
  while ((pFVar8 == (Fxu_Lit *)0x0 || (pFVar6 == (Fxu_Lit *)0x0))) {
    if ((pFVar8 == (Fxu_Lit *)0x0) || (pFVar6 != (Fxu_Lit *)0x0)) {
      if ((pFVar8 != (Fxu_Lit *)0x0) || (pFVar6 == (Fxu_Lit *)0x0)) {
        return iVar4;
      }
      pFVar6 = pFVar6->pVNext;
      pFVar8 = (Fxu_Lit *)0x0;
    }
    else {
      pFVar8 = pFVar8->pVNext;
      pFVar6 = (Fxu_Lit *)0x0;
    }
  }
  iVar1 = pFVar6->pCube->pVar->iVar;
  iVar2 = pFVar8->pCube->pVar->iVar;
  bVar9 = SBORROW4(iVar2,iVar1);
  iVar3 = iVar2 - iVar1;
  if (iVar2 == iVar1) {
    iVar1 = pFVar6->iCube;
    iVar2 = pFVar8->iCube;
    bVar9 = SBORROW4(iVar2,iVar1);
    iVar3 = iVar2 - iVar1;
    if (iVar2 == iVar1) goto LAB_003f5274;
  }
  if (bVar9 == iVar3 < 0) {
    pFVar6 = pFVar6->pVNext;
  }
  else {
    pFVar8 = pFVar8->pVNext;
  }
  goto LAB_003f521a;
LAB_003f5274:
  pFVar7 = (Fxu_ListLit *)&pFVar8->pVNext;
  pFVar5 = (Fxu_ListLit *)&pFVar6->pVNext;
  iVar4 = iVar4 + 1;
  goto LAB_003f5214;
}

Assistant:

int Fxu_SingleCountCoincidence( Fxu_Matrix * p, Fxu_Var * pVar1, Fxu_Var * pVar2 )
{
    Fxu_Lit * pLit1, * pLit2;
    int Result;

    // compute the coincidence count
    Result = 0;
    pLit1  = pVar1->lLits.pHead;
    pLit2  = pVar2->lLits.pHead;
    while ( 1 )
    {
        if ( pLit1 && pLit2 )
        {
            if ( pLit1->pCube->pVar->iVar == pLit2->pCube->pVar->iVar )
            { // the variables are the same
                if ( pLit1->iCube == pLit2->iCube )
                { // the literals are the same
                    pLit1 = pLit1->pVNext;
                    pLit2 = pLit2->pVNext;
                    // add this literal to the coincidence
                    Result++;
                }
                else if ( pLit1->iCube < pLit2->iCube )
                    pLit1 = pLit1->pVNext;
                else
                    pLit2 = pLit2->pVNext;
            }
            else if ( pLit1->pCube->pVar->iVar < pLit2->pCube->pVar->iVar )
                pLit1 = pLit1->pVNext;
            else
                pLit2 = pLit2->pVNext;
        }
        else if ( pLit1 && !pLit2 )
            pLit1 = pLit1->pVNext;
        else if ( !pLit1 && pLit2 )
            pLit2 = pLit2->pVNext;
        else
            break;
    }
    return Result;
}